

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O2

char * __thiscall
google::protobuf::io::Printer::WriteVariable
          (Printer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *vars,char *format,int *arg_index,
          vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *annotations)

{
  ulong uVar1;
  char *pcVar2;
  AnnotationCollector *pAVar3;
  undefined8 uVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  LogMessage *pLVar8;
  long lVar9;
  const_iterator cVar10;
  int iVar11;
  pointer ppVar12;
  string *this_00;
  int iVar13;
  char *data;
  long lVar14;
  size_type *local_e0;
  string sub;
  undefined1 local_a0 [8];
  string var_name;
  undefined1 local_78 [56];
  int *local_40;
  LogFinisher local_31;
  
  sub.field_2._8_8_ = vars;
  local_40 = arg_index;
  pcVar7 = strchr(format,0x24);
  if (pcVar7 == (char *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/io/printer.cc"
               ,0x13a);
    pLVar8 = internal::LogMessage::operator<<((LogMessage *)local_78," Unclosed variable name.");
    internal::LogFinisher::operator=((LogFinisher *)local_a0,pLVar8);
    internal::LogMessage::~LogMessage((LogMessage *)local_78);
  }
  if (pcVar7 == format) {
    IndentIfAtStart(this);
    push_back(this,'$');
  }
  else {
    var_name.field_2._8_8_ = args;
    if (*format == '{') {
      if ((int)format[1] - 0x3aU < 0xfffffff6) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/io/printer.cc"
                   ,0x144);
        pLVar8 = internal::LogMessage::operator<<
                           ((LogMessage *)local_78,"CHECK failed: std::isdigit(start[1]): ");
        internal::LogFinisher::operator=((LogFinisher *)local_a0,pLVar8);
        internal::LogMessage::~LogMessage((LogMessage *)local_78);
      }
      if ((long)pcVar7 - (long)format != 2) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/io/printer.cc"
                   ,0x145);
        pLVar8 = internal::LogMessage::operator<<
                           ((LogMessage *)local_78,"CHECK failed: (end - start) == (2): ");
        internal::LogFinisher::operator=((LogFinisher *)local_a0,pLVar8);
        internal::LogMessage::~LogMessage((LogMessage *)local_78);
      }
      iVar11 = (int)format[1];
      uVar1 = (long)iVar11 - 0x31;
      if ((iVar11 < 0x31) ||
         ((ulong)(*(long *)(var_name.field_2._8_8_ + 8) - *(long *)var_name.field_2._8_8_ >> 5) <=
          (uVar1 & 0xffffffff))) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/io/printer.cc"
                   ,0x148);
        pLVar8 = internal::LogMessage::operator<<((LogMessage *)local_78,"Annotation ${");
        pLVar8 = internal::LogMessage::operator<<(pLVar8,iVar11 + -0x30);
        pLVar8 = internal::LogMessage::operator<<(pLVar8,"$ is out of bounds.");
        internal::LogFinisher::operator=((LogFinisher *)local_a0,pLVar8);
        internal::LogMessage::~LogMessage((LogMessage *)local_78);
      }
      if (*local_40 < (int)uVar1) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/io/printer.cc"
                   ,0x14b);
        pLVar8 = internal::LogMessage::operator<<
                           ((LogMessage *)local_78,
                            "Annotation arg must be in correct order as given. Expected");
        pLVar8 = internal::LogMessage::operator<<(pLVar8," ${");
        pLVar8 = internal::LogMessage::operator<<(pLVar8,*local_40 + 1);
        pLVar8 = internal::LogMessage::operator<<(pLVar8,"$ got ${");
        pLVar8 = internal::LogMessage::operator<<(pLVar8,iVar11 + -0x30);
        pLVar8 = internal::LogMessage::operator<<(pLVar8,"$.");
        internal::LogFinisher::operator=((LogFinisher *)local_a0,pLVar8);
        internal::LogMessage::~LogMessage((LogMessage *)local_78);
      }
      else if ((int)uVar1 == *local_40) {
        *local_40 = iVar11 + -0x30;
      }
      IndentIfAtStart(this);
      local_78._0_8_ = this->offset_;
      this_00 = (string *)(local_78 + 0x10);
      local_78._8_8_ = (char *)0x0;
      std::__cxx11::string::string
                (this_00,(string *)(uVar1 * 0x20 + *(long *)var_name.field_2._8_8_));
      std::
      vector<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>>>
      ::emplace_back<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>>
                ((vector<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>>>
                  *)annotations,
                 (pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_78);
    }
    else {
      if (*format == '}') {
        if (annotations ==
            (vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x0) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_78,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/io/printer.cc"
                     ,0x154);
          pLVar8 = internal::LogMessage::operator<<
                             ((LogMessage *)local_78,"CHECK failed: annotations: ");
          internal::LogFinisher::operator=((LogFinisher *)local_a0,pLVar8);
          internal::LogMessage::~LogMessage((LogMessage *)local_78);
        }
        ppVar12 = (annotations->
                  super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if ((annotations->
            super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == ppVar12) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_78,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/io/printer.cc"
                     ,0x156);
          pLVar8 = internal::LogMessage::operator<<
                             ((LogMessage *)local_78,"Unexpected end of annotation found.");
          internal::LogFinisher::operator=((LogFinisher *)local_a0,pLVar8);
          internal::LogMessage::~LogMessage((LogMessage *)local_78);
          ppVar12 = (annotations->
                    super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        }
        ppVar12[-1].first.second = this->offset_;
        pAVar3 = this->annotation_collector_;
        if (pAVar3 != (AnnotationCollector *)0x0) {
          (**(code **)(*(long *)pAVar3 + 8))(pAVar3,ppVar12 + -1);
        }
        std::
        vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::pop_back(annotations);
        goto LAB_002fcf28;
      }
      for (lVar14 = 0; (pcVar2 = format + lVar14, pcVar2 < pcVar7 && (*pcVar2 == ' '));
          lVar14 = lVar14 + 1) {
      }
      if (pcVar2 == pcVar7) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/io/printer.cc"
                   ,0x161);
        pLVar8 = internal::LogMessage::operator<<((LogMessage *)local_78," Empty variable.");
        internal::LogFinisher::operator=((LogFinisher *)local_a0,pLVar8);
        internal::LogMessage::~LogMessage((LogMessage *)local_78);
      }
      lVar5 = 0;
      pcVar6 = pcVar7;
      do {
        data = pcVar6;
        lVar9 = lVar5;
        if (data <= pcVar2) break;
        lVar5 = lVar9 + 1;
        pcVar6 = data + -1;
      } while (data[-1] == ' ');
      local_a0 = (undefined1  [8])&var_name._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,pcVar2,(long)pcVar7 - lVar9);
      uVar4 = sub.field_2._8_8_;
      local_e0 = &sub._M_string_length;
      sub._M_dataplus._M_p = (pointer)0x0;
      sub._M_string_length._0_1_ = 0;
      if ((int)*(char *)local_a0 - 0x30U < 10) {
        if (var_name._M_dataplus._M_p != (pointer)0x1) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_78,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/io/printer.cc"
                     ,0x169);
          pLVar8 = internal::LogMessage::operator<<
                             ((LogMessage *)local_78,"CHECK failed: (var_name.size()) == (1): ");
          internal::LogFinisher::operator=(&local_31,pLVar8);
          internal::LogMessage::~LogMessage((LogMessage *)local_78);
        }
        iVar11 = (int)*(char *)local_a0;
        if (iVar11 < 0x31) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_78,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/io/printer.cc"
                     ,0x16b);
          pLVar8 = internal::LogMessage::operator<<
                             ((LogMessage *)local_78,"CHECK failed: (idx) >= (0): ");
          internal::LogFinisher::operator=(&local_31,pLVar8);
          internal::LogMessage::~LogMessage((LogMessage *)local_78);
        }
        if ((ulong)(*(long *)(var_name.field_2._8_8_ + 8) - *(long *)var_name.field_2._8_8_ >> 5) <=
            (long)iVar11 - 0x31U) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_78,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/io/printer.cc"
                     ,0x16d);
          pLVar8 = internal::LogMessage::operator<<((LogMessage *)local_78,"Argument $");
          pLVar8 = internal::LogMessage::operator<<(pLVar8,iVar11 + -0x30);
          pLVar8 = internal::LogMessage::operator<<(pLVar8,"$ is out of bounds.");
          internal::LogFinisher::operator=(&local_31,pLVar8);
          internal::LogMessage::~LogMessage((LogMessage *)local_78);
        }
        iVar13 = (int)((long)iVar11 - 0x31U);
        if (*local_40 < iVar13) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_78,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/io/printer.cc"
                     ,0x170);
          pLVar8 = internal::LogMessage::operator<<
                             ((LogMessage *)local_78,
                              "Arguments must be used in same order as given. Expected $");
          pLVar8 = internal::LogMessage::operator<<(pLVar8,*local_40 + 1);
          pLVar8 = internal::LogMessage::operator<<(pLVar8,"$ got $");
          pLVar8 = internal::LogMessage::operator<<(pLVar8,iVar11 + -0x30);
          pLVar8 = internal::LogMessage::operator<<(pLVar8,"$.");
          internal::LogFinisher::operator=(&local_31,pLVar8);
          internal::LogMessage::~LogMessage((LogMessage *)local_78);
        }
        else if (iVar13 == *local_40) {
          *local_40 = iVar11 + -0x30;
        }
        std::__cxx11::string::_M_assign((string *)&local_e0);
      }
      else {
        cVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)sub.field_2._8_8_,(key_type *)local_a0);
        if (cVar10._M_node == (_Base_ptr)(uVar4 + 8)) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_78,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/io/printer.cc"
                     ,0x179);
          pLVar8 = internal::LogMessage::operator<<((LogMessage *)local_78," Unknown variable: ");
          pLVar8 = internal::LogMessage::operator<<(pLVar8,(string *)local_a0);
          pLVar8 = internal::LogMessage::operator<<(pLVar8,".");
          internal::LogFinisher::operator=(&local_31,pLVar8);
          internal::LogMessage::~LogMessage((LogMessage *)local_78);
        }
        std::__cxx11::string::_M_assign((string *)&local_e0);
      }
      if (sub._M_dataplus._M_p != (pointer)0x0) {
        IndentIfAtStart(this);
        CopyToBuffer(this,format,(int)lVar14);
        CopyToBuffer(this,(char *)local_e0,(int)sub._M_dataplus._M_p);
        CopyToBuffer(this,data,(int)lVar9);
      }
      std::__cxx11::string::~string((string *)&local_e0);
      this_00 = (string *)local_a0;
    }
    std::__cxx11::string::~string(this_00);
  }
LAB_002fcf28:
  return pcVar7 + 1;
}

Assistant:

const char* Printer::WriteVariable(
    const std::vector<string>& args,
    const std::map<std::string, std::string>& vars, const char* format,
    int* arg_index, std::vector<AnnotationCollector::Annotation>* annotations) {
  auto start = format;
  auto end = strchr(format, '$');
  if (!end) {
    GOOGLE_LOG(FATAL) << " Unclosed variable name.";
  }
  format = end + 1;
  if (end == start) {
    // "$$" is an escape for just '$'
    IndentIfAtStart();
    push_back('$');
    return format;
  }
  if (*start == '{') {
    GOOGLE_CHECK(std::isdigit(start[1]));
    GOOGLE_CHECK_EQ(end - start, 2);
    int idx = start[1] - '1';
    if (idx < 0 || idx >= args.size()) {
      GOOGLE_LOG(FATAL) << "Annotation ${" << idx + 1 << "$ is out of bounds.";
    }
    if (idx > *arg_index) {
      GOOGLE_LOG(FATAL) << "Annotation arg must be in correct order as given. Expected"
                 << " ${" << (*arg_index) + 1 << "$ got ${" << idx + 1 << "$.";
    } else if (idx == *arg_index) {
      (*arg_index)++;
    }
    IndentIfAtStart();
    annotations->push_back({{offset_, 0}, args[idx]});
    return format;
  } else if (*start == '}') {
    GOOGLE_CHECK(annotations);
    if (annotations->empty()) {
      GOOGLE_LOG(FATAL) << "Unexpected end of annotation found.";
    }
    auto& a = annotations->back();
    a.first.second = offset_;
    if (annotation_collector_) annotation_collector_->AddAnnotationNew(a);
    annotations->pop_back();
    return format;
  }
  auto start_var = start;
  while (start_var < end && *start_var == ' ') start_var++;
  if (start_var == end) {
    GOOGLE_LOG(FATAL) << " Empty variable.";
  }
  auto end_var = end;
  while (start_var < end_var && *(end_var - 1) == ' ') end_var--;
  std::string var_name{
      start_var, static_cast<std::string::size_type>(end_var - start_var)};
  std::string sub;
  if (std::isdigit(var_name[0])) {
    GOOGLE_CHECK_EQ(var_name.size(), 1);  // No need for multi-digits
    int idx = var_name[0] - '1';   // Start counting at 1
    GOOGLE_CHECK_GE(idx, 0);
    if (idx >= args.size()) {
      GOOGLE_LOG(FATAL) << "Argument $" << idx + 1 << "$ is out of bounds.";
    }
    if (idx > *arg_index) {
      GOOGLE_LOG(FATAL) << "Arguments must be used in same order as given. Expected $"
                 << (*arg_index) + 1 << "$ got $" << idx + 1 << "$.";
    } else if (idx == *arg_index) {
      (*arg_index)++;
    }
    sub = args[idx];
  } else {
    auto it = vars.find(var_name);
    if (it == vars.end()) {
      GOOGLE_LOG(FATAL) << " Unknown variable: " << var_name << ".";
    }
    sub = it->second;
  }

  // By returning here in case of empty we also skip possible spaces inside
  // the $...$, i.e. "void$ dllexpor$ f();" -> "void f();" in the empty case.
  if (sub.empty()) return format;

  // We're going to write something non-empty so we need a possible indent.
  IndentIfAtStart();

  // Write the possible spaces in front.
  CopyToBuffer(start, start_var - start);
  // Write a non-empty substituted variable.
  CopyToBuffer(sub.c_str(), sub.size());
  // Finish off with writing possible trailing spaces.
  CopyToBuffer(end_var, end - end_var);
  return format;
}